

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int __status;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  __status = 0;
  if (CONCAT44(extraout_var,iVar1) == 1) {
    __status = 0;
    uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    if ((uVar2 & 1) != 0) {
      __status = (int)(CONCAT44(extraout_var_00,uVar2) >> 1);
    }
  }
  exit(__status);
}

Assistant:

int SmalltalkImage::stQuitPrimitive(InterpreterProxy *interpreter)
{
    int exitCode = 0;
    if (interpreter->getArgumentCount() == 1)
    {
        auto exitCodeObject = interpreter->getTemporary(0);
        if (exitCodeObject.isSmallInteger())
            exitCode = (int)exitCodeObject.decodeSmallInteger();
    }

    exit(exitCode);
    // Should never reach here.
}